

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64 __thiscall google::protobuf::Arena::FreeBlocks(Arena *this)

{
  Block *pBVar1;
  ThreadCache *pTVar2;
  Block *next;
  Block *first_block;
  Block *b;
  uint64 space_allocated;
  Arena *this_local;
  
  b = (Block *)0x0;
  first_block = (Block *)internal::NoBarrier_Load((Atomic64 *)(this + 8));
  next = (Block *)0x0;
  while (first_block != (Block *)0x0) {
    b = (Block *)((long)&b->owner + first_block->size);
    pBVar1 = first_block->next;
    if (pBVar1 == (Block *)0x0) {
      if (((byte)this[0x28] & 1) == 0) {
        next = first_block;
        first_block = pBVar1;
      }
      else {
        (**(code **)(this + 0x68))(first_block,first_block->size);
        first_block = pBVar1;
      }
    }
    else {
      (**(code **)(this + 0x68))(first_block,first_block->size);
      first_block = pBVar1;
    }
  }
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (((byte)this[0x28] & 1) == 0) {
    next->pos = 0x20;
    pTVar2 = thread_cache();
    next->owner = pTVar2;
    SetThreadCacheBlock(this,next);
    AddBlockInternal(this,next);
  }
  return (uint64)b;
}

Assistant:

uint64 Arena::FreeBlocks() {
  uint64 space_allocated = 0;
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  Block* first_block = NULL;
  while (b != NULL) {
    space_allocated += (b->size);
    Block* next = b->next;
    if (next != NULL) {
#ifdef ADDRESS_SANITIZER
      // This memory was provided by the underlying allocator as unpoisoned, so
      // return it in an unpoisoned state.
      ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
      options_.block_dealloc(b, b->size);
    } else {
      if (owns_first_block_) {
#ifdef ADDRESS_SANITIZER
        // This memory was provided by the underlying allocator as unpoisoned,
        // so return it in an unpoisoned state.
        ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
        options_.block_dealloc(b, b->size);
      } else {
        // User passed in the first block, skip free'ing the memory.
        first_block = b;
      }
    }
    b = next;
  }
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  if (!owns_first_block_) {
    // Make the first block that was passed in through ArenaOptions
    // available for reuse.
    first_block->pos = kHeaderSize;
    // Thread which calls Reset() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
  }
  return space_allocated;
}